

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O3

void __thiscall cmStateSnapshot::SetPolicy(cmStateSnapshot *this,PolicyID id,PolicyStatus status)

{
  bool bVar1;
  PointerType pSVar2;
  PointerType pPVar3;
  iterator psi;
  iterator local_38;
  
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  local_38.Tree = (pSVar2->Policies).Tree;
  local_38.Position = (pSVar2->Policies).Position;
  do {
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
    bVar1 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator!=
                      (&local_38,pSVar2->PolicyRoot);
    if (!bVar1) {
      return;
    }
    pPVar3 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator->(&local_38);
    cmPolicies::PolicyMap::Set(&pPVar3->super_PolicyMap,id,status);
    pPVar3 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator->(&local_38);
    bVar1 = pPVar3->Weak;
    cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator++(&local_38);
  } while (bVar1 != false);
  return;
}

Assistant:

void cmStateSnapshot::SetPolicy(cmPolicies::PolicyID id,
                                cmPolicies::PolicyStatus status)
{
  // Update the policy stack from the top to the top-most strong entry.
  bool previous_was_weak = true;
  for (cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator psi =
         this->Position->Policies;
       previous_was_weak && psi != this->Position->PolicyRoot; ++psi) {
    psi->Set(id, status);
    previous_was_weak = psi->Weak;
  }
}